

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

ExceptionOr<unsigned_int> * __thiscall
kj::_::ExceptionOr<unsigned_int>::operator=
          (ExceptionOr<unsigned_int> *this,ExceptionOr<unsigned_int> *param_1)

{
  ExceptionOr<unsigned_int> *param_1_local;
  ExceptionOr<unsigned_int> *this_local;
  
  ExceptionOrValue::operator=(&this->super_ExceptionOrValue,&param_1->super_ExceptionOrValue);
  Maybe<unsigned_int>::operator=(&this->value,&param_1->value);
  return this;
}

Assistant:

ExceptionOr& operator=(ExceptionOr&&) = default;